

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

ItemSimilarityRecommender_SimilarItems *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>(Arena *arena)

{
  ItemSimilarityRecommender_SimilarItems *this;
  
  if (arena == (Arena *)0x0) {
    this = (ItemSimilarityRecommender_SimilarItems *)operator_new(0x40);
    CoreML::Specification::ItemSimilarityRecommender_SimilarItems::
    ItemSimilarityRecommender_SimilarItems(this,(Arena *)0x0,false);
  }
  else {
    this = (ItemSimilarityRecommender_SimilarItems *)
           AllocateAlignedWithHook
                     (arena,0x40,
                      (type_info *)
                      &CoreML::Specification::ItemSimilarityRecommender_SimilarItems::typeinfo);
    CoreML::Specification::ItemSimilarityRecommender_SimilarItems::
    ItemSimilarityRecommender_SimilarItems(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }